

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O1

bool __thiscall Datetime::initializeEaster(Datetime *this,Pig *pig)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint uVar3;
  size_type previous;
  tm *t;
  time_t tVar4;
  Datetime *pDVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<int> __l_00;
  time_t now;
  vector<int,_std::allocator<int>_> offsets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  holidays;
  string token;
  undefined1 local_110 [8];
  vector<int,_std::allocator<int>_> local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  previous = Pig::cursor(pig);
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"eastermonday","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"easter","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"ascension","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"pentecost","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"goodfriday","");
  __l._M_len = 5;
  __l._M_array = &local_d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f0,__l,(allocator_type *)&local_108);
  lVar7 = 0;
  do {
    if (local_48 + lVar7 != *(undefined1 **)((long)local_58 + lVar7)) {
      operator_delete(*(undefined1 **)((long)local_58 + lVar7));
    }
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0xa0);
  local_d8._M_dataplus._M_p = (pointer)0x1;
  local_d8._M_string_length = 0x3100000027;
  local_d8.field_2._M_allocated_capacity._0_4_ = 0xfffffffe;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_d8;
  std::vector<int,_std::allocator<int>_>::vector(&local_108,__l_00,(allocator_type *)local_110);
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity._0_4_ =
       local_d8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  bVar8 = true;
  lVar7 = 0;
  uVar6 = 0;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  do {
    bVar2 = Pig::skipLiteral(pig,(string *)
                                 ((long)&((local_f0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
    if (bVar2) {
      uVar3 = Pig::peek(pig);
      bVar2 = unicodeLatinAlpha(uVar3);
      if (!bVar2) {
        uVar3 = Pig::peek(pig);
        bVar2 = unicodeLatinDigit(uVar3);
        if (!bVar2) {
          local_110 = (undefined1  [8])time((time_t *)0x0);
          pDVar5 = (Datetime *)local_110;
          t = localtime((time_t *)pDVar5);
          easter(pDVar5,(tm *)t);
          tVar4 = mktime(t);
          this->_date = tVar4;
          if (tVar4 < (long)local_110) {
            pDVar5 = (Datetime *)local_110;
            t = localtime((time_t *)pDVar5);
            t->tm_year = t->tm_year + 1;
            easter(pDVar5,(tm *)t);
          }
          t->tm_mday = t->tm_mday +
                       local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar6];
          tVar4 = mktime(t);
          this->_date = tVar4;
          goto LAB_0012f8b5;
        }
      }
    }
    bVar8 = uVar6 < 4;
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x20;
  } while (uVar6 != 5);
  Pig::restoreTo(pig,previous);
LAB_0012f8b5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0);
  return bVar8;
}

Assistant:

bool Datetime::initializeEaster (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  std::vector <std::string> holidays = {"eastermonday", "easter", "ascension", "pentecost", "goodfriday"};
  std::vector <int>         offsets  = {             1,        0,          39,          49,           -2};

  std::string token;
  for (int holiday = 0; holiday < 5; ++holiday)
  {
   if (pig.skipLiteral (holidays[holiday]) &&
       ! unicodeLatinAlpha (pig.peek ()) &&
       ! unicodeLatinDigit (pig.peek ()))
    {
      time_t now = time (nullptr);
      struct tm* t = localtime (&now);

      easter (t);
      _date = mktime (t);

      // If the result is earlier this year, then recalc for next year.
      if (_date < now)
      {
        t = localtime (&now);
        t->tm_year++;
        easter (t);
      }

      // Adjust according to holiday-specific offsets.
      t->tm_mday += offsets[holiday];

      _date = mktime (t);
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}